

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeStringOps.cpp
# Opt level: O1

double gmlc::utilities::getTimeValue(string_view timeString,time_units defUnit)

{
  string_view unitString;
  size_t *in_RCX;
  utilities *this;
  size_type __rlen;
  char *pcVar1;
  string_view input;
  string_view input_00;
  string_view trimCharacters;
  size_t pos;
  size_t in_stack_ffffffffffffffc8;
  utilities *local_28;
  
  input._M_len = timeString._M_str;
  this = (utilities *)timeString._M_len;
  input._M_str = (char *)&local_28;
  pcVar1 = (char *)strViewToFloat<double>(this,input,in_RCX);
  if (local_28 <= this && (long)this - (long)local_28 != 0) {
    input_00._M_str = input._M_len + (long)local_28;
    input_00._M_len = (long)this - (long)local_28;
    trimCharacters._M_str = " \t\n\r";
    trimCharacters._M_len = 4;
    string_viewOps::trim(input_00,trimCharacters);
    unitString._M_str = pcVar1;
    unitString._M_len = in_stack_ffffffffffffffc8;
    defUnit = timeUnitsFromString(unitString);
  }
  return (double)pcVar1 * timeCountReverse[(int)defUnit];
}

Assistant:

double getTimeValue(std::string_view timeString, time_units defUnit)
{
    size_t pos;
    double val = numConvComp<double>(timeString, pos);
    if (pos >= timeString.size()) {
        return val * toSecondMultiplier(defUnit);
    }
    auto units = string_viewOps::trim(timeString.substr(pos));
    return val * toSecondMultiplier(timeUnitsFromString(units));
}